

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::DescriptorScriptPubKeyMan::CheckDecryptionKey
          (DescriptorScriptPubKeyMan *this,CKeyingMaterial *master_key)

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  runtime_error *this_00;
  LogFlags flag;
  bool bVar5;
  long in_FS_OFFSET;
  bool bVar6;
  span<const_unsigned_char,_18446744073709551615UL> crypted_secret;
  string_view logging_function;
  string_view source_file;
  _Base_ptr fmt;
  CKey key;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock55;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar6 = false;
  flag = NONE;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock55,&this->cs_desc_man,"cs_desc_man",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x822,false);
  if ((this->m_map_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    bVar6 = (this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
    fmt = &(this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header._M_header;
    for (p_Var4 = (this->m_map_crypted_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar5 = false, p_Var4 != fmt;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4)) {
      key.fCompressed = false;
      key.keydata._M_t.
      super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
           (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
            )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
              )0x0;
      crypted_secret._M_extent._M_extent_value =
           (long)p_Var4[4]._M_parent - (long)*(pointer *)(p_Var4 + 4);
      crypted_secret._M_ptr = *(pointer *)(p_Var4 + 4);
      bVar3 = DecryptKey(master_key,crypted_secret,(CPubKey *)&p_Var4[1]._M_right,&key);
      bVar1 = this->m_decryption_thoroughly_checked;
      bVar5 = false;
      bVar6 = (bool)(bVar6 | bVar3);
      std::
      unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ::~unique_ptr(&key.keydata);
      if (!bVar3) {
        bVar5 = true;
        break;
      }
      if ((bVar1 & 1U) != 0) break;
    }
    if (bVar6 == false) {
      bVar6 = false;
    }
    else {
      if (bVar5) {
        logging_function._M_str = "CheckDecryptionKey";
        logging_function._M_len = 0x12;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
        ;
        source_file._M_len = 99;
        LogPrintf_<>(logging_function,source_file,0x836,flag,(Level)this,(char *)fmt);
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,
                   "Error unlocking wallet: some keys decrypt but not all. Your wallet file may be corrupt."
                  );
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_001fa985;
      }
      this->m_decryption_thoroughly_checked = true;
      bVar6 = true;
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock55.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar6;
  }
LAB_001fa985:
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::CheckDecryptionKey(const CKeyingMaterial& master_key)
{
    LOCK(cs_desc_man);
    if (!m_map_keys.empty()) {
        return false;
    }

    bool keyPass = m_map_crypted_keys.empty(); // Always pass when there are no encrypted keys
    bool keyFail = false;
    for (const auto& mi : m_map_crypted_keys) {
        const CPubKey &pubkey = mi.second.first;
        const std::vector<unsigned char> &crypted_secret = mi.second.second;
        CKey key;
        if (!DecryptKey(master_key, crypted_secret, pubkey, key)) {
            keyFail = true;
            break;
        }
        keyPass = true;
        if (m_decryption_thoroughly_checked)
            break;
    }
    if (keyPass && keyFail) {
        LogPrintf("The wallet is probably corrupted: Some keys decrypt but not all.\n");
        throw std::runtime_error("Error unlocking wallet: some keys decrypt but not all. Your wallet file may be corrupt.");
    }
    if (keyFail || !keyPass) {
        return false;
    }
    m_decryption_thoroughly_checked = true;
    return true;
}